

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cc
# Opt level: O2

int __thiscall ResultHandler::handle(ResultHandler *this,Observables *observables,Values *results)

{
  ostream *poVar1;
  int iVar2;
  ulong uVar3;
  string local_50 [32];
  
  for (uVar3 = 0; uVar3 < (ulong)(*(long *)(results + 8) - *(long *)results >> 3); uVar3 = uVar3 + 1
      ) {
    poVar1 = std::ostream::_M_insert<double>(*(double *)(*(long *)results + uVar3 * 8));
    poVar1 = std::operator<<(poVar1," ");
    (*(observables->
      super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>)._M_impl
      .super__Vector_impl_data._M_start[uVar3]->_vptr_Observable[1])(local_50);
    poVar1 = std::operator<<(poVar1,local_50);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(local_50);
  }
  iVar2 = this->m_callcount + 1;
  this->m_callcount = iVar2;
  return (int)(iVar2 == this->m_maxcall);
}

Assistant:

int handle(const SSM::Observables& observables,
	     const SSM::Values& results)
  {
    for(int i(0); i<results.size(); i++)
      std::cout << results[i] << " " 
		<< observables[i]->unit() << std::endl;
    
    m_callcount +=1;

    if(m_callcount==m_maxcall)
      return 1;
    
    return 0;
  }